

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popup_inter.cpp
# Opt level: O3

void popup_inter_start_do_proc
               (Am_Object *inter,int x,int y,Am_Object *ref_obj,Am_Input_Char param_5)

{
  Am_Input_Char start_char;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object sub_menu_window;
  Am_Object sub_inter;
  Am_Object main_win;
  Am_Object local_70;
  int local_68;
  int local_64;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  
  local_68 = y;
  local_64 = x;
  pAVar2 = Am_Object::Get(inter,0x1d2,0);
  Am_Object::Am_Object(&local_70,pAVar2);
  bVar1 = Am_Object::Valid(&local_70);
  if (bVar1) {
    Am_Translate_Coordinates(ref_obj,x,y,&Am_Screen,&local_64,&local_68);
    Am_Object::Set(&local_70,100,local_64,0);
    Am_Object::Set(&local_70,0x65,local_68,0);
    pAVar2 = Am_Object::Get(inter,0x68,0);
    Am_Object::Am_Object(&local_30,pAVar2);
    set_popup_win_visible(&local_70,true,&local_30);
    Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_70,0x1d2);
    Am_Object::Get_Object(&local_38,(Am_Slot_Key)&local_40,0x1ac);
    Am_Object::~Am_Object(&local_40);
    Am_Object::Am_Object(&local_48,&local_38);
    Am_Object::Am_Object(&local_50,&Am_No_Object);
    start_char = Am_Default_Start_Char;
    Am_Object::Am_Object(&local_58,&Am_No_Object);
    Am_Start_Interactor(&local_48,&local_50,start_char,&local_58,0,0,true);
    Am_Object::~Am_Object(&local_58);
    Am_Object::~Am_Object(&local_50);
    Am_Object::~Am_Object(&local_48);
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&local_30);
  }
  Am_Object::Am_Object(&local_60,inter);
  Am_Abort_Interactor(&local_60,true);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_70);
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void, popup_inter_start_do,
                 (Am_Object inter, int x, int y, Am_Object ref_obj,
                  Am_Input_Char /* ic */))
{
  Am_Object sub_menu_window = inter.Get(Am_SUB_MENU);
  if (sub_menu_window.Valid()) {
    Am_Translate_Coordinates(ref_obj, x, y, Am_Screen, x, y);
    sub_menu_window.Set(Am_LEFT, x);
    sub_menu_window.Set(Am_TOP, y);
    Am_Object main_win = inter.Get(Am_WINDOW);
    set_popup_win_visible(sub_menu_window, true, main_win);
    Am_Object sub_inter =
        sub_menu_window.Get_Object(Am_SUB_MENU).Get_Object(Am_INTERACTOR);
    Am_Start_Interactor(sub_inter);
  }
  Am_Abort_Interactor(inter); //so the do method isn't called on start
}